

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agentf.c
# Opt level: O2

void agentf_got_response(agentf *af,void *reply,int replylen)

{
  char *pcVar1;
  size_t sVar2;
  
  af->pending = (agent_pending_query *)0x0;
  pcVar1 = "";
  if (reply != (void *)0x0) {
    pcVar1 = (char *)reply;
  }
  sVar2 = 5;
  if (reply != (void *)0x0) {
    sVar2 = (long)replylen;
  }
  (*af->c->vt->write)(af->c,false,pcVar1,sVar2);
  return;
}

Assistant:

static void agentf_got_response(agentf *af, void *reply, int replylen)
{
    af->pending = NULL;

    if (!reply) {
        /* The real agent didn't send any kind of reply at all for
         * some reason, so fake an SSH_AGENT_FAILURE. */
        reply = "\0\0\0\1\5";
        replylen = 5;
    }

    sshfwd_write(af->c, reply, replylen);
}